

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void ptrmapPutOvflPtr(MemPage *pPage,MemPage *pSrc,u8 *pCell,int *pRC)

{
  int iVar1;
  u32 key;
  long in_FS_OFFSET;
  undefined1 local_48 [20];
  ushort uStack_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  stack0xffffffffffffffc8 = &DAT_aaaaaaaaaaaaaaaa;
  local_48._0_4_ = 0xaaaaaaaa;
  local_48._4_4_ = 0xaaaaaaaa;
  local_48._8_4_ = 0xaaaaaaaa;
  local_48._12_4_ = 0xaaaaaaaa;
  if (*pRC == 0) {
    (*pPage->xParseCell)(pPage,pCell,(CellInfo *)local_48);
    if ((uint)uStack_34 < (uint)local_48._16_4_) {
      if ((pCell < pSrc->aDataEnd) && (pSrc->aDataEnd < pCell + uStack_34)) {
        iVar1 = sqlite3CorruptError(0x11aaf);
        *pRC = iVar1;
      }
      else {
        key = sqlite3Get4byte(pCell + (((ulong)stack0xffffffffffffffc8 >> 0x30) - 4));
        ptrmapPut(pPage->pBt,key,'\x03',pPage->pgno,pRC);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void ptrmapPutOvflPtr(MemPage *pPage, MemPage *pSrc, u8 *pCell,int *pRC){
  CellInfo info;
  if( *pRC ) return;
  assert( pCell!=0 );
  pPage->xParseCell(pPage, pCell, &info);
  if( info.nLocal<info.nPayload ){
    Pgno ovfl;
    if( SQLITE_OVERFLOW(pSrc->aDataEnd, pCell, pCell+info.nLocal) ){
      testcase( pSrc!=pPage );
      *pRC = SQLITE_CORRUPT_BKPT;
      return;
    }
    ovfl = get4byte(&pCell[info.nSize-4]);
    ptrmapPut(pPage->pBt, ovfl, PTRMAP_OVERFLOW1, pPage->pgno, pRC);
  }
}